

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O2

void chaiscript::Boxed_Number::check_divide_by_zero<unsigned_short>(unsigned_short t,type *param_2)

{
  arithmetic_error *this;
  undefined6 in_register_0000003a;
  allocator local_39;
  string local_38;
  
  if ((int)CONCAT62(in_register_0000003a,t) != 0) {
    return;
  }
  this = (arithmetic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&local_38,"divide by zero",&local_39);
  exception::arithmetic_error::arithmetic_error(this,&local_38);
  __cxa_throw(this,&exception::arithmetic_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static inline void check_divide_by_zero(T t, typename std::enable_if<std::is_integral<T>::value>::type* = nullptr)
      {
#ifndef CHAISCRIPT_NO_PROTECT_DIVIDEBYZERO
        if (t == 0) {
          throw chaiscript::exception::arithmetic_error("divide by zero");
        }
#endif
      }